

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleFilterCols64_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x32,int dx)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = (ulong)x32;
  if (1 < dst_width) {
    lVar2 = 0;
    do {
      dst_ptr[lVar2] =
           (char)(((uint)src_ptr[((long)uVar1 >> 0x10) + 1] - (uint)src_ptr[(long)uVar1 >> 0x10]) *
                  ((uint)(uVar1 >> 9) & 0x7f) + 0x40 >> 7) + src_ptr[(long)uVar1 >> 0x10];
      lVar3 = uVar1 + (long)dx;
      lVar4 = lVar3 >> 0x10;
      dst_ptr[lVar2 + 1] =
           (char)(((uint)src_ptr[lVar4 + 1] - (uint)src_ptr[lVar4]) *
                  ((uint)(dx + (int)uVar1) >> 9 & 0x7f) + 0x40 >> 7) + src_ptr[lVar4];
      uVar1 = lVar3 + dx;
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < dst_width + -1);
    dst_ptr = dst_ptr + lVar2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr = (char)(((uint)src_ptr[((long)uVar1 >> 0x10) + 1] - (uint)src_ptr[(long)uVar1 >> 0x10]
                      ) * ((uint)(uVar1 >> 9) & 0x7f) + 0x40 >> 7) + src_ptr[(long)uVar1 >> 0x10];
  }
  return;
}

Assistant:

void ScaleFilterCols64_C(uint8_t* dst_ptr,
                         const uint8_t* src_ptr,
                         int dst_width,
                         int x32,
                         int dx) {
  int64_t x = (int64_t)(x32);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}